

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

void nn_msgqueue_term(nn_msgqueue *self)

{
  FILE *__stream;
  char *pcVar1;
  undefined1 local_78 [8];
  nn_msg msg;
  int rc;
  nn_msgqueue *self_local;
  
  while( true ) {
    msg.body.u._28_4_ = nn_msgqueue_recv(self,(nn_msg *)local_78);
    __stream = _stderr;
    if (msg.body.u._28_4_ == -0xb) break;
    if ((int)msg.body.u._28_4_ < 0) {
      pcVar1 = nn_err_strerror(-msg.body.u._28_4_);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar1,(ulong)(uint)-msg.body.u._28_4_,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/msgqueue.c"
              ,0x3d);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_msg_term((nn_msg *)local_78);
  }
  if ((self->in).chunk != (self->out).chunk) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->in.chunk == self->out.chunk",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/msgqueue.c"
            ,0x43);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_free((self->in).chunk);
  if (self->cache != (nn_msgqueue_chunk *)0x0) {
    nn_free(self->cache);
  }
  return;
}

Assistant:

void nn_msgqueue_term (struct nn_msgqueue *self)
{
    int rc;
    struct nn_msg msg;

    /*  Deallocate messages in the pipe. */
    while (1) {
        rc = nn_msgqueue_recv (self, &msg);
        if (rc == -EAGAIN)
            break;
        errnum_assert (rc >= 0, -rc);
        nn_msg_term (&msg);
    }

    /*  There are no more messages in the pipe so there's at most one chunk
        in the queue. Deallocate it. */
    nn_assert (self->in.chunk == self->out.chunk);
    nn_free (self->in.chunk);

    /*  Deallocate the cached chunk, if any. */
    if (self->cache)
        nn_free (self->cache);
}